

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void put_image_version(FILE *fp,uint8_t version)

{
  size_t sVar1;
  size_t sStack_28;
  int rc;
  size_t header_size;
  undefined1 local_18;
  undefined1 local_17;
  undefined1 local_16;
  uint8_t local_15;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  uint8_t header [8];
  uint8_t version_local;
  FILE *fp_local;
  
  header_size._7_1_ = 0x6c;
  local_18 = 0x73;
  local_17 = 0x74;
  local_16 = 0x21;
  if (version < 3) {
    local_14 = 0;
    local_13 = 0;
    local_12 = 0;
    sStack_28 = 8;
  }
  else {
    sStack_28 = 5;
  }
  local_15 = version;
  header[0] = version;
  unique0x10000067 = fp;
  sVar1 = fwrite((void *)((long)&header_size + 7),sStack_28,1,(FILE *)fp);
  if ((int)sVar1 != 1) {
    error_impl("put_image_version",0x439,"put_image_version(): Unable to write version header data!"
              );
  }
  return;
}

Assistant:

void put_image_version(FILE *fp, uint8_t version)
{
    uint8_t header[IMAGE_HEADER_SIZE_OLD];
    size_t header_size = 0;
    int rc = 0;

    header[0] = (uint8_t)'l';
    header[1] = (uint8_t)'s';
    header[2] = (uint8_t)'t';
    header[3] = (uint8_t)'!';
    header[4] = version;

    if(version <= IMAGE_VERSION_2) {
        /* add the padding. */
        header[5] = (uint8_t)0;
        header[6] = (uint8_t)0;
        header[7] = (uint8_t)0;

        header_size = IMAGE_HEADER_SIZE_OLD;
    } else {
        header_size = IMAGE_HEADER_SIZE;
    }

    rc = (int)fwrite(&header, header_size, 1, fp);

    if(rc != 1) {
        error("put_image_version(): Unable to write version header data!");
    }
}